

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int OptNArgs(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  char **ppcVar5;
  char *__s;
  
  iVar4 = 0;
  if (((argv != (char **)0x0) && (iVar4 = 0, *argv != (char *)0x0)) &&
     (__s = argv[1], __s != (char *)0x0)) {
    ppcVar5 = argv + 2;
    bVar1 = false;
    iVar4 = 0;
    do {
      if ((bVar1) ||
         (((*__s != '+' && (*__s != '-')) && (pcVar3 = strchr(__s,0x3d), pcVar3 == (char *)0x0)))) {
        iVar4 = iVar4 + 1;
      }
      iVar2 = strcmp(__s,"--");
      if (iVar2 == 0) {
        bVar1 = true;
      }
      __s = *ppcVar5;
      ppcVar5 = ppcVar5 + 1;
    } while (__s != (char *)0x0);
  }
  return iVar4;
}

Assistant:

int OptNArgs(){
  int cnt = 0;
  int dashdash = 0;
  int i;
  if( argv!=0 && argv[0]!=0 ){
    for(i=1; argv[i]; i++){
      if( dashdash || !ISOPT(argv[i]) ) cnt++;
      if( strcmp(argv[i],"--")==0 ) dashdash = 1;
    }
  }
  return cnt;
}